

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int smooth_(int *n,double *x,double *y,double *w,double *span,int *iper,double *vsmlsq,double *smo,
           double *acvr)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  iVar4 = iabs(*iper);
  uVar3 = *n;
  uVar6 = (ulong)uVar3;
  uVar7 = (uint)((double)(int)uVar3 * *span * 0.5 + 0.5);
  uVar9 = 2;
  if (2 < (int)uVar7) {
    uVar9 = uVar7;
  }
  if ((int)(uVar9 * 2) < 0) {
    dVar20 = 0.0;
    dVar24 = 0.0;
    dVar23 = 0.0;
    dVar19 = 0.0;
    dVar18 = 0.0;
  }
  else {
    uVar7 = 0;
    if (iVar4 == 2) {
      uVar7 = ~uVar9;
    }
    iVar13 = uVar7 + uVar3;
    lVar12 = (ulong)(uVar9 * 2) + 1;
    iVar15 = 1;
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar24 = 0.0;
    dVar20 = 0.0;
    dVar21 = 0.0;
    lVar14 = (long)(int)uVar7;
    do {
      iVar13 = iVar13 + 1;
      if (lVar14 + 1 < 1) {
        dVar27 = x[(int)uVar3 + lVar14] + -1.0;
        iVar8 = iVar13;
      }
      else {
        dVar27 = x[lVar14];
        iVar8 = iVar15 + uVar7;
      }
      lVar16 = (long)iVar8;
      dVar26 = w[lVar16 + -1];
      dVar23 = dVar21 + dVar26;
      if (0.0 < dVar23) {
        dVar24 = (dVar24 * dVar21 + y[lVar16 + -1] * dVar26) / dVar23;
      }
      dVar20 = (double)(~-(ulong)(0.0 < dVar23) & (ulong)dVar20 |
                       (ulong)((dVar21 * dVar20 + dVar27 * dVar26) / dVar23) &
                       -(ulong)(0.0 < dVar23));
      dVar21 = (double)(-(ulong)(0.0 < dVar21) &
                       (ulong)((dVar26 * dVar23 * (dVar27 - dVar20)) / dVar21));
      dVar19 = dVar19 + (dVar27 - dVar20) * dVar21;
      dVar18 = dVar18 + (y[lVar16 + -1] - dVar24) * dVar21;
      iVar15 = iVar15 + 1;
      lVar12 = lVar12 + -1;
      dVar21 = dVar23;
      lVar14 = lVar14 + 1;
    } while (lVar12 != 0);
  }
  if (0 < (int)uVar3) {
    iVar13 = *iper;
    uVar5 = (ulong)uVar9;
    lVar14 = (long)(int)-uVar9;
    iVar15 = 1;
    uVar10 = 0;
    do {
      uVar17 = uVar5 + 1 + uVar10;
      dVar21 = dVar24;
      if ((iVar4 == 2) || (uVar17 <= uVar6 && 0 < (long)(lVar14 + uVar10))) {
        iVar8 = uVar9 + iVar15;
        if ((long)(lVar14 + uVar10) < 1) {
          iVar11 = (uVar3 - uVar9) + (int)uVar10;
          dVar27 = x[lVar14 + uVar6 + (uVar10 - 1)] + -1.0;
LAB_00133365:
          dVar26 = x[uVar5 + uVar10];
        }
        else {
          iVar11 = ~uVar9 + iVar15;
          if (uVar17 <= uVar6) {
            dVar27 = x[lVar14 + (uVar10 - 1)];
            goto LAB_00133365;
          }
          iVar8 = (uVar9 - uVar3) + 1 + (int)uVar10;
          dVar26 = x[(uVar5 + uVar10) - uVar6] + 1.0;
          dVar27 = x[lVar14 + (uVar10 - 1)];
        }
        dVar1 = w[(long)iVar11 + -1];
        dVar28 = dVar23 - dVar1;
        dVar25 = dVar20;
        if (0.0 < dVar28) {
          dVar25 = (dVar23 * dVar20 - dVar27 * dVar1) / dVar28;
        }
        if (0.0 < dVar28) {
          dVar21 = (dVar23 * dVar24 - y[(long)iVar11 + -1] * dVar1) / dVar28;
        }
        lVar12 = (long)iVar8;
        dVar2 = w[lVar12 + -1];
        dVar22 = dVar28 + dVar2;
        if (0.0 < dVar22) {
          dVar21 = (dVar21 * dVar28 + y[lVar12 + -1] * dVar2) / dVar22;
        }
        dVar27 = dVar27 - dVar20;
        uVar17 = -(ulong)(0.0 < dVar28);
        dVar20 = (double)(~-(ulong)(0.0 < dVar22) & (ulong)dVar25 |
                         (ulong)((dVar28 * dVar25 + dVar26 * dVar2) / dVar22) &
                         -(ulong)(0.0 < dVar22));
        dVar25 = (double)((ulong)((dVar2 * dVar22 * (dVar26 - dVar20)) / dVar28) & uVar17);
        dVar23 = (double)(~uVar17 & 0x8000000000000000 |
                         (ulong)((dVar1 * -dVar23 * dVar27) / dVar28) & uVar17);
        dVar19 = (dVar26 - dVar20) * dVar25 + dVar27 * dVar23 + dVar19;
        dVar18 = (y[lVar12 + -1] - dVar21) * dVar25 +
                 (y[(long)iVar11 + -1] - dVar24) * dVar23 + dVar18;
        dVar23 = dVar22;
      }
      uVar17 = uVar10 + 1;
      smo[uVar10] = (x[uVar10] - dVar20) *
                    (double)(-(ulong)(*vsmlsq < dVar19) & (ulong)(dVar18 / dVar19)) + dVar21;
      if (0 < iVar13) {
        dVar24 = (double)(-(ulong)(0.0 < dVar23) & (ulong)(1.0 / dVar23));
        if (*vsmlsq <= dVar19 && dVar19 != *vsmlsq) {
          dVar24 = dVar24 + ((x[uVar10] - dVar20) * (x[uVar10] - dVar20)) / dVar19;
        }
        acvr[uVar10] = 0.0;
        dVar24 = 1.0 - dVar24 * w[uVar10];
        if (dVar24 <= 0.0) {
          if (uVar17 < 2) goto LAB_001335aa;
          dVar24 = acvr[uVar10 - 1];
        }
        else {
          dVar24 = ABS(y[uVar10] - smo[uVar10]) / dVar24;
        }
        acvr[uVar10] = dVar24;
      }
LAB_001335aa:
      iVar15 = iVar15 + 1;
      uVar10 = uVar17;
      dVar24 = dVar21;
    } while (uVar6 != uVar17);
  }
  uVar9 = 1;
  do {
    lVar14 = (long)(int)uVar9;
    dVar24 = w[lVar14 + -1];
    dVar23 = smo[lVar14 + -1] * dVar24;
    uVar7 = uVar9;
    if ((int)uVar9 < (int)uVar3) {
      lVar12 = 0;
      do {
        if (x[lVar14 + lVar12 + -1] <= x[lVar14 + lVar12] &&
            x[lVar14 + lVar12] != x[lVar14 + lVar12 + -1]) {
          uVar7 = (int)lVar12 + uVar9;
          break;
        }
        dVar23 = dVar23 + smo[lVar14 + lVar12] * w[lVar14 + lVar12];
        dVar24 = dVar24 + w[lVar14 + lVar12];
        lVar12 = lVar12 + 1;
        uVar7 = uVar3;
      } while ((int)uVar3 - lVar14 != lVar12);
    }
    if ((int)uVar9 < (int)uVar7) {
      lVar12 = -1;
      do {
        smo[lVar14 + lVar12] = (double)(-(ulong)(0.0 < dVar24) & (ulong)(dVar23 / dVar24));
        lVar12 = lVar12 + 1;
      } while (uVar7 - uVar9 != (int)lVar12);
    }
    uVar9 = uVar7 + 1;
    if ((int)uVar3 <= (int)uVar7) {
      return uVar7;
    }
  } while( true );
}

Assistant:

static int smooth_(int *n, double *x, double *y, double *w, double *span, int *iper, double *vsmlsq, double *smo, double *acvr)
{
    /* System generated locals */
    int i__1;
    double r__1;
    double d__1;

    /* Local variables */
    double a, h__;
    int i__, j, j0, in, it;
    double xm, ym, wt, sy, fbo, fbw;
    int ibw;
    double var, tmp;
    double xti;
    int out;
    double xto;
    double cvar;
    int jper;

    /* Parameter adjustments */
    --acvr;
    --smo;
    --w;
    --y;
    --x;

    /* Function Body */
    xm = 0.f;
    ym = xm;
    var = ym;
    cvar = var;
    fbw = cvar;
    jper = iabs(*iper);
    ibw = *span * .5 * *n + .5;
    if (ibw < 2) {
	ibw = 2;
    }
    it = (ibw << 1) + 1;
    i__1 = it;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = i__;
	if (jper == 2) {
	    j = i__ - ibw - 1;
	}
	xti = x[j];
	if (j >= 1) {
	    goto L10;
	}
	j = *n + j;
	xti = x[j] - 1.0;
L10:
	wt = w[j];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[j]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[j] - ym);
/* L20: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	out = j - ibw - 1;
	in = j + ibw;
	if (jper != 2 && (out < 1 || in > *n)) {
	    goto L60;
	}
	if (out >= 1) {
	    goto L30;
	}
	out = *n + out;
	xto = x[out] - 1.0;
	xti = x[in];
	goto L50;
L30:
	if (in <= *n) {
	    goto L40;
	}
	in -= *n;
	xti = x[in] + 1.0;
	xto = x[out];
	goto L50;
L40:
	xto = x[out];
	xti = x[in];
L50:
	wt = w[out];
	fbo = fbw;
	fbw -= wt;
	tmp = 0.0;
	if (fbw > 0.0) {
	    tmp = fbo * wt * (xto - xm) / fbw;
	}
	var -= tmp * (xto - xm);
	cvar -= tmp * (y[out] - ym);
	if (fbw > 0.0) {
	    xm = (fbo * xm - wt * xto) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym - wt * y[out]) / fbw;
	}
	wt = w[in];
	fbo = fbw;
	fbw += wt;
	if (fbw > 0.0) {
	    xm = (fbo * xm + wt * xti) / fbw;
	}
	if (fbw > 0.0) {
	    ym = (fbo * ym + wt * y[in]) / fbw;
	}
	tmp = 0.0;
	if (fbo > 0.0) {
	    tmp = fbw * wt * (xti - xm) / fbo;
	}
	var += tmp * (xti - xm);
	cvar += tmp * (y[in] - ym);
L60:
	a = 0.0;
	if (var > *vsmlsq) {
	    a = cvar / var;
	}
	smo[j] = a * (x[j] - xm) + ym;
	if (*iper <= 0) {
	    goto L80;
	}
	h__ = 0.0;
	if (fbw > 0.0) {
	    h__ = 1.0 / fbw;
	}
	if (var > *vsmlsq) {
/* Computing 2nd power */
	    d__1 = x[j] - xm;
	    h__ += d__1 * d__1 / var;
	}
	acvr[j] = 0.0;
	a = 1.0 - w[j] * h__;
	if (a <= 0.0) {
	    goto L70;
	}
	acvr[j] = (r__1 = y[j] - smo[j], fabs(r__1)) / a;
	goto L80;
L70:
	if (j <= 1) {
	    goto L80;
	}
	acvr[j] = acvr[j - 1];
L80:
	;
    }
    j = 1;
L90:
    j0 = j;
    sy = smo[j] * w[j];
    fbw = w[j];
    if (j >= *n) {
	goto L110;
    }
L100:
    if (x[j + 1] > x[j]) {
	goto L110;
    }
    ++j;
    sy += w[j] * smo[j];
    fbw += w[j];
    if (j < *n) {
	goto L100;
    }
L110:
    if (j <= j0) {
	goto L130;
    }
    a = 0.0;
    if (fbw > 0.0) {
	a = sy / fbw;
    }
    i__1 = j;
    for (i__ = j0; i__ <= i__1; ++i__) {
	smo[i__] = a;
/* L120: */
    }
L130:
    ++j;
    if (j <= *n) {
	goto L90;
    }
    return 0;
}